

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundatanode_inmem.c
# Opt level: O2

SUNErrCode
SUNDataNode_CreateObject_InMem
          (sundataindex init_size,SUNContext_conflict sunctx,SUNDataNode *node_out)

{
  SUNHashMap in_RAX;
  SUNDataNode pSVar1;
  SUNHashMap map;
  SUNHashMap local_28;
  
  local_28 = in_RAX;
  pSVar1 = sunDataNode_CreateCommon_InMem(sunctx);
  pSVar1->dtype = SUNDATANODE_OBJECT;
  SUNHashMap_New(init_size,sunDataNode_FreeKeyValue_InMem,&local_28);
  *(SUNHashMap *)((long)pSVar1->content + 0x20) = local_28;
  *node_out = pSVar1;
  return 0;
}

Assistant:

SUNErrCode SUNDataNode_CreateObject_InMem(sundataindex init_size,
                                          SUNContext sunctx,
                                          SUNDataNode* node_out)
{
  SUNFunctionBegin(sunctx);

  SUNDataNode node = sunDataNode_CreateCommon_InMem(sunctx);

  BASE_MEMBER(node, dtype) = SUNDATANODE_OBJECT;

  SUNHashMap map;
  SUNCheckCall(SUNHashMap_New(init_size, sunDataNode_FreeKeyValue_InMem, &map));

  IMPL_MEMBER(node, named_children) = map;

  *node_out = node;
  return SUN_SUCCESS;
}